

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::findcaller(Forth *this)

{
  Definition *pDVar1;
  size_type sVar2;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  Xt local_4c;
  Cell local_48;
  Xt xtfound;
  uint address;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string wordBuffer;
  Forth *this_local;
  
  wordBuffer.field_2._8_8_ = this;
  requireDStackDepth(this,1,"FIND-CALLER");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,0x10,' ',&local_31);
  std::allocator<char>::~allocator(&local_31);
  local_48 = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  local_4c = findDoes(this,local_48);
  if (local_4c != 0) {
    pDVar1 = definitionsAt(this,local_4c);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
               &pDVar1->name);
  }
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  if (sVar2 < 0x10) {
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30
                      );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,0x10 - sVar2,' ',&local_71);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
               &local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  if (this->writeToTarget == ToString) {
    std::operator<<((ostream *)&this->field_0x20,(string *)local_30);
  }
  else if (this->writeToTarget == ToStdCout) {
    std::operator<<((ostream *)&std::cout,(string *)local_30);
    std::ostream::flush();
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void  findcaller() {
			REQUIRE_DSTACK_DEPTH(1, "FIND-CALLER");
			std::string wordBuffer(16,' ');
			auto address = dStack.getTop(); pop();
			auto xtfound=findDoes(address);
			//std::cout << std::endl << address << " "<< xt << " " << xtfound << std::endl;
			if(xtfound>0){
				wordBuffer=definitionsAt(xtfound).name;	
			} 
			if(wordBuffer.size()<16) {
			 wordBuffer.append(std::string(16-wordBuffer.size(), ' '));
			}

#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			switch (writeToTarget) {
			case ToString:
				std_cout << wordBuffer  ;
				break;
			case ToStdCout:
				std::cout << wordBuffer ;
				std::cout.flush();
				break;
			default:
				break;
			}
#endif
		}